

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

QFixed __thiscall
QTextDocumentLayoutPrivate::scaleToDevice(QTextDocumentLayoutPrivate *this,QFixed value)

{
  QPaintDevice *pQVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  pQVar1 = (this->super_QAbstractTextDocumentLayoutPrivate).paintDevice;
  if (pQVar1 != (QPaintDevice *)0x0) {
    iVar2 = (*pQVar1->_vptr_QPaintDevice[4])(pQVar1,8);
    iVar3 = qt_defaultDpi();
    if (iVar3 == 0) {
      value.val = 0x7fffffff;
    }
    else {
      uVar5 = (ulong)(uint)-value.val;
      if (0 < value.val) {
        uVar5 = (ulong)(uint)value.val;
      }
      uVar4 = iVar2 * -0x40;
      if (iVar2 * -0x40 < 0) {
        uVar4 = iVar2 * 0x40;
      }
      uVar5 = uVar4 * uVar5 >> 6;
      uVar4 = (uint)uVar5;
      uVar5 = uVar5 & 0xffffffff;
      if ((int)uVar4 < 1) {
        uVar5 = (ulong)-uVar4;
      }
      uVar6 = -uVar4;
      if (-1 < (iVar2 * 0x40 ^ value.val)) {
        uVar6 = uVar4;
      }
      uVar4 = iVar3 * -0x40;
      if (iVar3 * -0x40 < 0) {
        uVar4 = iVar3 * 0x40;
      }
      iVar2 = (int)(((ulong)(uVar4 >> 1) + uVar5 * 0x40) / (ulong)uVar4);
      value.val = -iVar2;
      if (-1 < (int)(uVar6 ^ iVar3 * 0x40)) {
        value.val = iVar2;
      }
    }
  }
  return (QFixed)value.val;
}

Assistant:

QFixed QTextDocumentLayoutPrivate::scaleToDevice(QFixed value) const
{
    if (!paintDevice)
        return value;
    return value * QFixed(paintDevice->logicalDpiY()) / QFixed(qt_defaultDpi());
}